

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode cf_tcp_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  char *pcVar8;
  curltime cVar9;
  char local_158 [8];
  char buffer [256];
  undefined4 uStack_4c;
  int error;
  int rc;
  CURLcode result;
  cf_socket_ctx *ctx;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar3 = cf->ctx;
  error = 7;
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  if (blocking) {
    return CURLE_UNSUPPORTED_PROTOCOL;
  }
  *done = false;
  if (*(int *)((long)pvVar3 + 0x98) == -1) {
    error = cf_socket_open(cf,data);
    if (error != CURLE_OK) goto LAB_001198a7;
    if ((cf->field_0x24 & 1) != 0) {
      *done = true;
      return CURLE_OK;
    }
    iVar5 = do_connect(cf,data,((ulong)cf->conn->bits >> 0x17 & 1) != 0);
    piVar7 = __errno_location();
    iVar1 = *piVar7;
    set_local_ip(cf,data);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"local address %s port %d...",(long)pvVar3 + 0xca,
                        (ulong)*(uint *)((long)pvVar3 + 0xfc));
    }
    if (iVar5 == -1) {
      error = socket_connect_result(data,(char *)((long)pvVar3 + 0x9c),iVar1);
      goto LAB_001198a7;
    }
  }
  uVar6 = Curl_socket_check(-1,-1,*(curl_socket_t *)((long)pvVar3 + 0x98),0);
  if (uVar6 == 0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"not connected yet");
    }
    return CURLE_OK;
  }
  if ((uVar6 == 2) || (((ulong)cf->conn->bits >> 0x17 & 1) != 0)) {
    _Var4 = verifyconnect(*(curl_socket_t *)((long)pvVar3 + 0x98),(int *)((long)pvVar3 + 0x130));
    if (_Var4) {
      cVar9 = Curl_now();
      buffer._248_8_ = cVar9.tv_sec;
      *(undefined8 *)((long)pvVar3 + 0x110) = buffer._248_8_;
      *(ulong *)((long)pvVar3 + 0x118) = CONCAT44(uStack_4c,cVar9.tv_usec);
      set_local_ip(cf,data);
      *done = true;
      cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"connected");
      }
      return CURLE_OK;
    }
  }
  else if ((uVar6 & 4) != 0) {
    verifyconnect(*(curl_socket_t *)((long)pvVar3 + 0x98),(int *)((long)pvVar3 + 0x130));
    error = 7;
  }
LAB_001198a7:
  if (error != 0) {
    if (*(int *)((long)pvVar3 + 0x130) != 0) {
      set_local_ip(cf,data);
      (data->state).os_errno = *(int *)((long)pvVar3 + 0x130);
      iVar1 = *(int *)((long)pvVar3 + 0x130);
      piVar7 = __errno_location();
      *piVar7 = iVar1;
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        uVar6 = *(uint *)((long)pvVar3 + 0xf8);
        uVar2 = *(uint *)((long)pvVar3 + 0xfc);
        pcVar8 = Curl_strerror(*(int *)((long)pvVar3 + 0x130),local_158,0x100);
        Curl_infof(data,"connect to %s port %u from %s port %d failed: %s",(long)pvVar3 + 0x9c,
                   (ulong)uVar6,(long)pvVar3 + 0xca,(ulong)uVar2,pcVar8);
      }
    }
    if (*(int *)((long)pvVar3 + 0x98) != -1) {
      socket_close(data,cf->conn,1,*(curl_socket_t *)((long)pvVar3 + 0x98));
      *(undefined4 *)((long)pvVar3 + 0x98) = 0xffffffff;
    }
    *done = false;
  }
  return error;
}

Assistant:

static CURLcode cf_tcp_connect(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool blocking, bool *done)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_COULDNT_CONNECT;
  int rc = 0;

  (void)data;
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* TODO: need to support blocking connect? */
  if(blocking)
    return CURLE_UNSUPPORTED_PROTOCOL;

  *done = FALSE; /* a very negative world view is best */
  if(ctx->sock == CURL_SOCKET_BAD) {
    int error;

    result = cf_socket_open(cf, data);
    if(result)
      goto out;

    if(cf->connected) {
      *done = TRUE;
      return CURLE_OK;
    }

    /* Connect TCP socket */
    rc = do_connect(cf, data, cf->conn->bits.tcp_fastopen);
    error = SOCKERRNO;
    set_local_ip(cf, data);
    CURL_TRC_CF(data, cf, "local address %s port %d...",
                ctx->ip.local_ip, ctx->ip.local_port);
    if(-1 == rc) {
      result = socket_connect_result(data, ctx->ip.remote_ip, error);
      goto out;
    }
  }

#ifdef mpeix
  /* Call this function once now, and ignore the results. We do this to
     "clear" the error state on the socket so that we can later read it
     reliably. This is reported necessary on the MPE/iX operating
     system. */
  (void)verifyconnect(ctx->sock, NULL);
#endif
  /* check socket for connect */
  rc = SOCKET_WRITABLE(ctx->sock, 0);

  if(rc == 0) { /* no connection yet */
    CURL_TRC_CF(data, cf, "not connected yet");
    return CURLE_OK;
  }
  else if(rc == CURL_CSELECT_OUT || cf->conn->bits.tcp_fastopen) {
    if(verifyconnect(ctx->sock, &ctx->error)) {
      /* we are connected with TCP, awesome! */
      ctx->connected_at = Curl_now();
      set_local_ip(cf, data);
      *done = TRUE;
      cf->connected = TRUE;
      CURL_TRC_CF(data, cf, "connected");
      return CURLE_OK;
    }
  }
  else if(rc & CURL_CSELECT_ERR) {
    (void)verifyconnect(ctx->sock, &ctx->error);
    result = CURLE_COULDNT_CONNECT;
  }

out:
  if(result) {
    if(ctx->error) {
      set_local_ip(cf, data);
      data->state.os_errno = ctx->error;
      SET_SOCKERRNO(ctx->error);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      {
        char buffer[STRERROR_LEN];
        infof(data, "connect to %s port %u from %s port %d failed: %s",
              ctx->ip.remote_ip, ctx->ip.remote_port,
              ctx->ip.local_ip, ctx->ip.local_port,
              Curl_strerror(ctx->error, buffer, sizeof(buffer)));
      }
#endif
    }
    if(ctx->sock != CURL_SOCKET_BAD) {
      socket_close(data, cf->conn, TRUE, ctx->sock);
      ctx->sock = CURL_SOCKET_BAD;
    }
    *done = FALSE;
  }
  return result;
}